

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTxInIndex(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  local_58;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>::
  function<cfd::js::api::GetIndexDataStruct(&)(cfd::js::api::GetTxInIndexRequestStruct_const&),void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>
              *)&local_38,TransactionStructApi::GetTxInIndex);
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>::
  function<cfd::js::api::GetIndexDataStruct(&)(cfd::js::api::GetTxInIndexRequestStruct_const&),void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::GetTxInIndex);
  ExecuteElementsCheckApi<cfd::js::api::json::GetTxInIndexRequest,cfd::js::api::json::GetIndexData,cfd::js::api::GetTxInIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  ::~function(&local_58);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTxInIndex(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::GetTxInIndexRequest, api::json::GetIndexData,
      api::GetTxInIndexRequestStruct, api::GetIndexDataStruct>(
      request_message, TransactionStructApi::GetTxInIndex,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::GetTxInIndex);
#else
      TransactionStructApi::GetTxInIndex);
#endif
}